

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# language.cpp
# Opt level: O2

void language::formatMemberFnPtr(QTextStream *str,SignalSlot *s,OverloadUse useQOverload)

{
  QStringView *lhs;
  QStringView *pQVar1;
  QStringView *pQVar2;
  bool bVar3;
  Data *pDVar4;
  Data *pDVar5;
  QTextStream *pQVar6;
  long lVar7;
  QChar QVar8;
  long lVar9;
  long in_FS_OFFSET;
  QLatin1String QVar10;
  QLatin1StringView latin1;
  QStringView QVar11;
  QStringView QVar12;
  QArrayDataPointer<char16_t> local_98;
  QArrayDataPointer<QStringView> local_78;
  QLatin1StringView local_58;
  QStringView local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pDVar4 = (Data *)QString::indexOf(&s->signature,(QChar)0x28,0,CaseSensitive);
  pQVar1 = (QStringView *)(s->signature).d.ptr;
  local_78.d = (Data *)(s->signature).d.size;
  pDVar5 = pDVar4;
  if (local_78.d < pDVar4) {
    pDVar5 = local_78.d;
  }
  local_78.ptr = pQVar1;
  QVar12 = QStringView::mid((QStringView *)&local_78,
                            (qsizetype)
                            ((long)&(pDVar4->super_QArrayData).ref_._q_value.
                                    super___atomic_base<int>._M_i + 1),
                            (long)local_78.d + (-2 - (long)pDVar4));
  if ((useQOverload == WhenAmbiguousOrEmpty) &&
     (QVar12.m_size == 0 ||
      ((s->options).super_QFlagsStorageHelper<language::SignalSlotOption,_4>.
       super_QFlagsStorage<language::SignalSlotOption>.i & 1) != 0)) {
    local_98.size = -0x5555555555555556;
    local_98.d = (Data *)0xaaaaaaaaaaaaaaaa;
    local_98.ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
    latin1.m_data = "qOverload<";
    latin1.m_size = 10;
    QString::QString((QString *)&local_98,latin1);
    local_78.size = -0x5555555555555556;
    local_78.d = (Data *)0xaaaaaaaaaaaaaaaa;
    local_78.ptr = (QStringView *)0xaaaaaaaaaaaaaaaa;
    local_48 = QVar12;
    QStringView::split(&local_78,&local_48,0x2c,0,1);
    lVar7 = local_78.size << 4;
    for (lVar9 = 0; pQVar2 = local_78.ptr, lVar7 != lVar9; lVar9 = lVar9 + 0x10) {
      QVar8.ucs = (char16_t)&local_98;
      if (lVar9 != 0) {
        QString::append(QVar8);
      }
      lhs = (QStringView *)((long)&pQVar2->m_size + lVar9);
      if ((lhs->m_size == 0) || (**(short **)((long)&pQVar2->m_data + lVar9) != 0x51)) {
LAB_0014957c:
        QString::append((QChar *)&local_98,*(longlong *)((long)&pQVar2->m_data + lVar9));
      }
      else {
        local_48.m_data = (storage_type_conflict *)"QPoint";
        local_48.m_size = 6;
        bVar3 = operator!=(lhs,(QLatin1StringView *)&local_48);
        if (!bVar3) goto LAB_0014957c;
        local_58.m_size = 5;
        local_58.m_data = "QSize";
        bVar3 = operator!=(lhs,&local_58);
        if (!bVar3) goto LAB_0014957c;
        QVar10.m_data = (char *)0x6;
        QVar10.m_size = (qsizetype)&local_98;
        QString::append(QVar10);
        QString::append((QChar *)&local_98,*(longlong *)((long)&pQVar2->m_data + lVar9));
        QString::append(QVar8);
      }
    }
    QString::append((QChar)(char16_t)&local_98);
    QArrayDataPointer<QStringView>::~QArrayDataPointer(&local_78);
    pQVar6 = (QTextStream *)QTextStream::operator<<(str,(QString *)&local_98);
    QTextStream::operator<<(pQVar6,'(');
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_98);
    pQVar6 = (QTextStream *)QTextStream::operator<<(str,'&');
    pQVar6 = (QTextStream *)QTextStream::operator<<(pQVar6,&s->className);
    pQVar6 = (QTextStream *)QTextStream::operator<<(pQVar6,"::");
    QVar11.m_data = (storage_type_conflict *)pQVar1;
    QVar11.m_size = (qsizetype)pDVar5;
    QTextStream::operator<<(pQVar6,QVar11);
    QTextStream::operator<<(str,')');
  }
  else {
    pQVar6 = (QTextStream *)QTextStream::operator<<(str,'&');
    pQVar6 = (QTextStream *)QTextStream::operator<<(pQVar6,&s->className);
    pQVar6 = (QTextStream *)QTextStream::operator<<(pQVar6,"::");
    QVar12.m_data = (storage_type_conflict *)pQVar1;
    QVar12.m_size = (qsizetype)pDVar5;
    QTextStream::operator<<(pQVar6,QVar12);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void formatMemberFnPtr(QTextStream &str, const SignalSlot &s, OverloadUse useQOverload)
{
    const qsizetype parenPos = s.signature.indexOf(u'(');
    Q_ASSERT(parenPos >= 0);
    const auto functionName = QStringView{s.signature}.left(parenPos);

    const auto parameters = QStringView{s.signature}.mid(parenPos + 1,
                                               s.signature.size() - parenPos - 2);

    const bool isAmbiguous = s.options.testFlag(SignalSlotOption::Ambiguous);
    bool withOverload = false; // just to silence the compiler

    switch (useQOverload) {
    case OverloadUse::Always:
        withOverload = true;
        break;
    case OverloadUse::Never:
        withOverload = false;
        break;
    case OverloadUse::WhenAmbiguousOrEmpty:
        withOverload = parameters.empty() || isAmbiguous;
        break;
    }

    if (withOverload)
        str << formatOverload(parameters) << '(';

    str << '&' << s.className << "::" << functionName;

    if (withOverload)
        str << ')';
}